

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool mjs::interpreter::impl::handle_completion(completion *c,label_set *labels)

{
  completion_type cVar1;
  bool bVar2;
  bool bVar3;
  completion local_58;
  
  cVar1 = c->type;
  bVar3 = true;
  switch(cVar1) {
  case break_:
    if (1 < cVar1 - break_) {
      __assert_fail("c.has_target()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x363,
                    "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                   );
    }
    bVar2 = completion::in_set(c,labels);
    if (bVar2) {
      completion::completion(&local_58,(value *)&value::undefined,normal);
      c->type = local_58.type;
      value::operator=(&c->result,&local_58.result);
      (c->target)._M_len = local_58.target._M_len;
      (c->target)._M_str = local_58.target._M_str;
      value::destroy(&local_58.result);
    }
    break;
  case continue_:
    if (1 < cVar1 - break_) {
      __assert_fail("c.has_target()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                    ,0x36b,
                    "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                   );
    }
    bVar3 = completion::in_set(c,labels);
    if (!bVar3) {
      return true;
    }
    completion::completion(&local_58,(value *)&value::undefined,normal);
    c->type = local_58.type;
    value::operator=(&c->result,&local_58.result);
    (c->target)._M_len = local_58.target._M_len;
    (c->target)._M_str = local_58.target._M_str;
    value::destroy(&local_58.result);
  case normal:
    bVar3 = false;
    break;
  case return_:
  case throw_:
    break;
  default:
    __assert_fail("c.type == completion_type::normal",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                  ,0x371,
                  "static bool mjs::interpreter::impl::handle_completion(completion &, const label_set &)"
                 );
  }
  return bVar3;
}

Assistant:

static bool handle_completion(completion& c, const label_set& labels) {
        if (c.type == completion_type::break_) {
            assert(c.has_target());
            if (c.in_set(labels)) {
                c = completion{};
            }
            return true;
        } else if (c.type == completion_type::return_ || c.type == completion_type::throw_) {
            return true;
        } else if (c.type == completion_type::continue_) {
            assert(c.has_target());
            if (!c.in_set(labels)) {
                return true;
            }
            c = completion{};
        } else {
            assert(c.type == completion_type::normal);
        }
        return false;
    }